

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.h
# Opt level: O2

int __thiscall
soplex::
SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::clone(SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  
  this_00 = (SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)operator_new(0x40);
  SPxEquiliSC(this_00,this);
  return (int)this_00;
}

Assistant:

inline virtual SPxScaler<R>* clone() const override
   {
      return new SPxEquiliSC<R>(*this);
   }